

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasDrawLineNoAA(int x0,int y0,int x1,int y1,Canvas *ptr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  int local_60;
  int local_5c;
  int local_54;
  uint local_48;
  uint local_44;
  int x_1;
  int x;
  double l;
  int y;
  int ystep;
  int error;
  int deltay;
  int deltax;
  bool steep;
  Canvas *ptr_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  
  ptr_local._0_4_ = y1;
  ptr_local._4_4_ = x1;
  y1_local = y0;
  x1_local = x0;
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else {
    iVar2 = abs(y1 - y0);
    iVar3 = abs(ptr_local._4_4_ - x1_local);
    bVar1 = iVar3 < iVar2;
    if (bVar1) {
      swap(&x1_local,&y1_local);
      swap((int *)((long)&ptr_local + 4),(int *)&ptr_local);
    }
    if (ptr_local._4_4_ < x1_local) {
      swap(&x1_local,(int *)((long)&ptr_local + 4));
      swap(&y1_local,(int *)&ptr_local);
    }
    iVar2 = ptr_local._4_4_ - x1_local;
    iVar3 = abs((int)ptr_local - y1_local);
    y = iVar2 / 2;
    iVar4 = -1;
    if (y1_local < (int)ptr_local) {
      iVar4 = 1;
    }
    l._0_4_ = y1_local;
    if (x1_local < 0) {
      dVar5 = (double)-x1_local / (double)(ptr_local._4_4_ - x1_local);
      x1_local = 0;
      l._0_4_ = (uint)((double)y1_local * (1.0 - dVar5) + (double)(int)ptr_local * dVar5);
    }
    if (bVar1) {
      local_54 = ptr->height;
    }
    else {
      local_54 = ptr->width;
    }
    if (x1_local <= local_54) {
      if (bVar1) {
        local_5c = ptr->height;
      }
      else {
        local_5c = ptr->width;
      }
      if (local_5c < ptr_local._4_4_) {
        if (bVar1) {
          local_60 = ptr->height;
        }
        else {
          local_60 = ptr->width;
        }
        ptr_local._4_4_ = local_60;
      }
      if (bVar1) {
        for (local_44 = x1_local; (int)local_44 <= ptr_local._4_4_; local_44 = local_44 + 1) {
          if ((l._0_4_ < (uint)ptr->width) && (local_44 < (uint)ptr->height)) {
            CanvasDrawPointInternal(l._0_4_,local_44,1.0,ptr);
          }
          y = y - iVar3;
          if (y < 0) {
            l._0_4_ = iVar4 + l._0_4_;
            y = iVar2 + y;
          }
        }
      }
      else {
        for (local_48 = x1_local; (int)local_48 <= ptr_local._4_4_; local_48 = local_48 + 1) {
          if ((local_48 < (uint)ptr->width) && (l._0_4_ < (uint)ptr->height)) {
            CanvasDrawPointInternal(local_48,l._0_4_,1.0,ptr);
          }
          y = y - iVar3;
          if (y < 0) {
            l._0_4_ = iVar4 + l._0_4_;
            y = iVar2 + y;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CanvasDrawLineNoAA(int x0, int y0, int x1, int y1, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		bool steep = abs(y1 - y0) > abs(x1 - x0);
		if(steep)
		{
			swap(x0, y0);
			swap(x1, y1);
		}
		if(x0 > x1)
		{
			swap(x0, x1);
			swap(y0, y1);
		}
		int deltax = x1 - x0;
		int deltay = abs(y1 - y0);
		int error = deltax / 2;
		int ystep = y0 < y1 ? 1 : -1;
		int y = y0;
		if(x0 < 0)
		{
			double l = double(-x0) / (x1 - x0);
			x0 = 0;
			y = int(y0 * (1.0 - l) + y1 * l);
		}
		if(x0 > (steep ? ptr->height : ptr->width))
			return;
		if(x1 > (steep ? ptr->height : ptr->width))
			x1 = steep ? ptr->height : ptr->width;
		if(steep)
		{
			for(int x = x0; x <= x1; x++)
			{
				if((unsigned)y < (unsigned)ptr->width && (unsigned)x < (unsigned)ptr->height)
					CanvasDrawPointInternal(y, x, 1.0, ptr);
				error -= deltay;
				if(error < 0)
				{
					y += ystep;
					error += deltax;
				}
			}
		}else{
			for(int x = x0; x <= x1; x++)
			{
				if((unsigned)x < (unsigned)ptr->width && (unsigned)y < (unsigned)ptr->height)
					CanvasDrawPointInternal(x, y, 1.0, ptr);
				error -= deltay;
				if(error < 0)
				{
					y += ystep;
					error += deltax;
				}
			}
		}
	}